

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O3

void __thiscall Assimp::XFileParser::ParseDataObjectFrame(XFileParser *this,Node *pParent)

{
  pointer *pppNVar1;
  pointer *pppMVar2;
  iterator iVar3;
  Scene *pSVar4;
  iterator __position;
  int iVar5;
  int iVar6;
  Node *pNVar7;
  Logger *this_00;
  Mesh *this_01;
  Node *node;
  Node *exroot;
  string name;
  Mesh *mesh;
  Node *local_98;
  undefined1 local_90 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  undefined1 local_50 [32];
  
  local_70._M_allocated_capacity = (size_type)&local_60;
  local_70._8_8_ = 0;
  local_60._M_local_buf[0] = '\0';
  readHeadOfDataObject(this,(string *)&local_70);
  local_98 = (Node *)operator_new(0x98);
  (local_98->mName)._M_dataplus._M_p = (pointer)&(local_98->mName).field_2;
  (local_98->mName)._M_string_length = 0;
  (local_98->mName).field_2._M_local_buf[0] = '\0';
  (local_98->mTrafoMatrix).a1 = 1.0;
  (local_98->mTrafoMatrix).a2 = 0.0;
  (local_98->mTrafoMatrix).a3 = 0.0;
  (local_98->mTrafoMatrix).a4 = 0.0;
  (local_98->mTrafoMatrix).b1 = 0.0;
  (local_98->mTrafoMatrix).b2 = 1.0;
  (local_98->mTrafoMatrix).b3 = 0.0;
  (local_98->mTrafoMatrix).b4 = 0.0;
  (local_98->mTrafoMatrix).c1 = 0.0;
  (local_98->mTrafoMatrix).c2 = 0.0;
  (local_98->mTrafoMatrix).c3 = 1.0;
  (local_98->mTrafoMatrix).c4 = 0.0;
  (local_98->mTrafoMatrix).d1 = 0.0;
  (local_98->mTrafoMatrix).d2 = 0.0;
  (local_98->mTrafoMatrix).d3 = 0.0;
  (local_98->mTrafoMatrix).d4 = 1.0;
  local_98->mParent = pParent;
  (local_98->mChildren).
  super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->mChildren).
  super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->mChildren).
  super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->mMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->mMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->mMeshes).
  super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_assign((string *)local_98);
  if (pParent == (Node *)0x0) {
    pNVar7 = this->mScene->mRootNode;
    if (pNVar7 == (Node *)0x0) {
      this->mScene->mRootNode = local_98;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)pNVar7);
      if (iVar5 != 0) {
        pSVar4 = this->mScene;
        local_90._0_8_ = pSVar4->mRootNode;
        pNVar7 = (Node *)operator_new(0x98);
        (pNVar7->mName)._M_dataplus._M_p = (pointer)&(pNVar7->mName).field_2;
        (pNVar7->mName)._M_string_length = 0;
        (pNVar7->mName).field_2._M_local_buf[0] = '\0';
        (pNVar7->mTrafoMatrix).a1 = 1.0;
        (pNVar7->mTrafoMatrix).a2 = 0.0;
        (pNVar7->mTrafoMatrix).a3 = 0.0;
        (pNVar7->mTrafoMatrix).a4 = 0.0;
        (pNVar7->mTrafoMatrix).b1 = 0.0;
        (pNVar7->mTrafoMatrix).b2 = 1.0;
        (pNVar7->mTrafoMatrix).b3 = 0.0;
        (pNVar7->mTrafoMatrix).b4 = 0.0;
        (pNVar7->mTrafoMatrix).c1 = 0.0;
        (pNVar7->mTrafoMatrix).c2 = 0.0;
        (pNVar7->mTrafoMatrix).c3 = 1.0;
        (pNVar7->mTrafoMatrix).c4 = 0.0;
        (pNVar7->mTrafoMatrix).d1 = 0.0;
        (pNVar7->mTrafoMatrix).d2 = 0.0;
        (pNVar7->mTrafoMatrix).d3 = 0.0;
        (pNVar7->mTrafoMatrix).d4 = 1.0;
        pNVar7->mParent = (Node *)0x0;
        (pNVar7->mChildren).
        super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar7->mChildren).
        super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar7->mChildren).
        super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (pNVar7->mMeshes).
        super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (pNVar7->mMeshes).
        super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        (pNVar7->mMeshes).
        super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar4->mRootNode = pNVar7;
        pNVar7 = this->mScene->mRootNode;
        std::__cxx11::string::_M_replace
                  ((ulong)pNVar7,0,(char *)(pNVar7->mName)._M_string_length,0x6f48e4);
        pNVar7 = this->mScene->mRootNode;
        iVar3._M_current =
             (pNVar7->mChildren).
             super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (pNVar7->mChildren).
            super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<Assimp::XFile::Node*,std::allocator<Assimp::XFile::Node*>>::
          _M_realloc_insert<Assimp::XFile::Node*const&>
                    ((vector<Assimp::XFile::Node*,std::allocator<Assimp::XFile::Node*>> *)
                     &pNVar7->mChildren,iVar3,(Node **)local_90);
        }
        else {
          *iVar3._M_current = (Node *)local_90._0_8_;
          pppNVar1 = &(pNVar7->mChildren).
                      super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppNVar1 = *pppNVar1 + 1;
        }
        *(Node **)(local_90._0_8_ + 0x60) = this->mScene->mRootNode;
      }
      pNVar7 = this->mScene->mRootNode;
      iVar3._M_current =
           (pNVar7->mChildren).
           super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl
           .super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (pNVar7->mChildren).
          super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<Assimp::XFile::Node*,std::allocator<Assimp::XFile::Node*>>::
        _M_realloc_insert<Assimp::XFile::Node*const&>
                  ((vector<Assimp::XFile::Node*,std::allocator<Assimp::XFile::Node*>> *)
                   &pNVar7->mChildren,iVar3,&local_98);
      }
      else {
        *iVar3._M_current = local_98;
        pppNVar1 = &(pNVar7->mChildren).
                    super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
      }
      local_98->mParent = this->mScene->mRootNode;
    }
  }
  else {
    iVar3._M_current =
         (pParent->mChildren).
         super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar3._M_current ==
        (pParent->mChildren).
        super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Assimp::XFile::Node*,std::allocator<Assimp::XFile::Node*>>::
      _M_realloc_insert<Assimp::XFile::Node*const&>
                ((vector<Assimp::XFile::Node*,std::allocator<Assimp::XFile::Node*>> *)
                 &pParent->mChildren,iVar3,&local_98);
    }
    else {
      *iVar3._M_current = local_98;
      pppNVar1 = &(pParent->mChildren).
                  super__Vector_base<Assimp::XFile::Node_*,_std::allocator<Assimp::XFile::Node_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  do {
    GetNextToken_abi_cxx11_((string *)local_90,this);
    if (local_90._8_8_ == 0) {
      local_50._0_8_ = local_50 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Unexpected end of file reached while parsing frame","");
      ThrowException(this,(string *)local_50);
    }
    iVar5 = std::__cxx11::string::compare((char *)local_90);
    if (iVar5 != 0) {
      iVar6 = std::__cxx11::string::compare((char *)local_90);
      if (iVar6 == 0) {
        ParseDataObjectFrame(this,local_98);
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_90);
        if (iVar6 == 0) {
          ParseDataObjectTransformationMatrix(this,&local_98->mTrafoMatrix);
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_90);
          if (iVar6 == 0) {
            this_01 = (Mesh *)operator_new(600);
            XFile::Mesh::Mesh(this_01,(string *)&local_70);
            __position._M_current =
                 (local_98->mMeshes).
                 super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
            local_50._0_8_ = this_01;
            if (__position._M_current ==
                (local_98->mMeshes).
                super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage) {
              std::vector<Assimp::XFile::Mesh*,std::allocator<Assimp::XFile::Mesh*>>::
              _M_realloc_insert<Assimp::XFile::Mesh*const&>
                        ((vector<Assimp::XFile::Mesh*,std::allocator<Assimp::XFile::Mesh*>> *)
                         &local_98->mMeshes,__position,(Mesh **)local_50);
            }
            else {
              *__position._M_current = this_01;
              pppMVar2 = &(local_98->mMeshes).
                          super__Vector_base<Assimp::XFile::Mesh_*,_std::allocator<Assimp::XFile::Mesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
              *pppMVar2 = *pppMVar2 + 1;
            }
            ParseDataObjectMesh(this,(Mesh *)local_50._0_8_);
          }
          else {
            this_00 = DefaultLogger::get();
            Logger::warn(this_00,"Unknown data object in frame in x file");
            ParseUnknownDataObject(this);
          }
        }
      }
    }
    if ((Node *)local_90._0_8_ != (Node *)(local_90 + 0x10)) {
      operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
    }
  } while (iVar5 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_allocated_capacity != &local_60) {
    operator_delete((void *)local_70._M_allocated_capacity,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void XFileParser::ParseDataObjectFrame( Node* pParent)
{
    // A coordinate frame, or "frame of reference." The Frame template
    // is open and can contain any object. The Direct3D extensions (D3DX)
    // mesh-loading functions recognize Mesh, FrameTransformMatrix, and
    // Frame template instances as child objects when loading a Frame
    // instance.
    std::string name;
    readHeadOfDataObject(&name);

    // create a named node and place it at its parent, if given
    Node* node = new Node( pParent);
    node->mName = name;
    if( pParent)
    {
        pParent->mChildren.push_back( node);
    } else
    {
        // there might be multiple root nodes
        if( mScene->mRootNode != NULL)
        {
            // place a dummy root if not there
            if( mScene->mRootNode->mName != "$dummy_root")
            {
                Node* exroot = mScene->mRootNode;
                mScene->mRootNode = new Node( NULL);
                mScene->mRootNode->mName = "$dummy_root";
                mScene->mRootNode->mChildren.push_back( exroot);
                exroot->mParent = mScene->mRootNode;
            }
            // put the new node as its child instead
            mScene->mRootNode->mChildren.push_back( node);
            node->mParent = mScene->mRootNode;
        } else
        {
            // it's the first node imported. place it as root
            mScene->mRootNode = node;
        }
    }

    // Now inside a frame.
    // read tokens until closing brace is reached.
    bool running = true;
    while ( running )
    {
        std::string objectName = GetNextToken();
        if (objectName.size() == 0)
            ThrowException( "Unexpected end of file reached while parsing frame");

        if( objectName == "}")
            break; // frame finished
        else
        if( objectName == "Frame")
            ParseDataObjectFrame( node); // child frame
        else
        if( objectName == "FrameTransformMatrix")
            ParseDataObjectTransformationMatrix( node->mTrafoMatrix);
        else
        if( objectName == "Mesh")
        {
            Mesh* mesh = new Mesh(name);
            node->mMeshes.push_back( mesh);
            ParseDataObjectMesh( mesh);
        } else
        {
            ASSIMP_LOG_WARN("Unknown data object in frame in x file");
            ParseUnknownDataObject();
        }
    }
}